

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<QBluetoothPermission,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  undefined1 local_50 [16];
  QPermission local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._0_8_ = dbg->stream;
  ((Stream *)local_50._0_8_)->ref = ((Stream *)local_50._0_8_)->ref + 1;
  QPermission::QPermission<QBluetoothPermission,_true>(&local_40,(QBluetoothPermission *)a);
  ::operator<<((Stream *)(local_50 + 8),(QPermission *)local_50);
  QDebug::~QDebug((QDebug *)(local_50 + 8));
  ::QVariant::~QVariant(&local_40.m_data);
  QDebug::~QDebug((QDebug *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }